

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

void __thiscall CSnapshotBuilder::Init(CSnapshotBuilder *this,CSnapshot *pSnapshot)

{
  CSnapshot *this_00;
  int *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  if (((ulong)((long)*in_RSI + 8 + (long)in_RSI[1] * 8) < 0x10001) && (in_RSI[1] < 0x401)) {
    *(int *)(in_RDI + 0x10000) = *in_RSI;
    *(int *)(in_RDI + 0x11004) = in_RSI[1];
    this_00 = (CSnapshot *)(in_RDI + 0x10004);
    CSnapshot::Offsets(this_00);
    mem_copy(this_00,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    CSnapshot::DataStart(this_00);
    mem_copy(this_00,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  }
  else {
    dbg_assert_imp(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                   (char *)0x15d6cc);
    dbg_assert_imp(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                   (char *)0x15d6fb);
    dbg_msg("snapshot","invalid snapshot");
    *(undefined4 *)(in_RDI + 0x10000) = 0;
    *(undefined4 *)(in_RDI + 0x11004) = 0;
  }
  return;
}

Assistant:

void CSnapshotBuilder::Init(const CSnapshot *pSnapshot)
{
	if(pSnapshot->m_DataSize + sizeof(CSnapshot) + pSnapshot->m_NumItems * sizeof(int)*2 > CSnapshot::MAX_SIZE || pSnapshot->m_NumItems > MAX_ITEMS)
	{
		// key and offset per item
		dbg_assert(m_DataSize + sizeof(CSnapshot) + m_NumItems * sizeof(int)*2 < CSnapshot::MAX_SIZE, "too much data");
		dbg_assert(m_NumItems < MAX_ITEMS, "too many items");
		dbg_msg("snapshot", "invalid snapshot"); // remove me
		m_DataSize = 0;
		m_NumItems = 0;
		return;
	}

	m_DataSize = pSnapshot->m_DataSize;
	m_NumItems = pSnapshot->m_NumItems;
	mem_copy(m_aOffsets, pSnapshot->Offsets(), sizeof(int)*m_NumItems);
	mem_copy(m_aData, pSnapshot->DataStart(), m_DataSize);
}